

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# newtonmin.c
# Opt level: O1

void trstep_ddl(double *jac,double *sN,int N,double *dx,double maxstep,double *L,double *hess,
               double nlen,double *ioval,double *ssd,double *v,double *step)

{
  double dVar1;
  double *vec;
  double *C;
  double *C_00;
  double *C_01;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  double *pdVar5;
  double *pdVar6;
  ulong uVar7;
  double *pdVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  
  dVar12 = *ioval;
  dVar13 = ioval[1];
  dVar10 = ioval[2];
  vec = (double *)malloc((long)N << 3);
  C = (double *)malloc(8);
  C_00 = (double *)malloc(8);
  C_01 = (double *)malloc(8);
  if (nlen <= dVar12) {
    ioval[6] = 1.0;
    dVar12 = nlen;
    if (0 < N) {
      uVar3 = 0;
      do {
        step[uVar3] = sN[uVar3];
        uVar3 = uVar3 + 1;
      } while ((uint)N != uVar3);
    }
  }
  else {
    ioval[6] = 0.0;
    if ((ioval[7] == 1.0) && (!NAN(ioval[7]))) {
      ioval[7] = 0.0;
      if (0 < N) {
        uVar3 = 0;
        do {
          vec[uVar3] = jac[uVar3] / dx[uVar3];
          uVar3 = uVar3 + 1;
        } while ((uint)N != uVar3);
      }
      dVar9 = l2norm(vec,N);
      if (N < 1) {
        dVar13 = 0.0;
      }
      else {
        uVar2 = (ulong)(uint)N;
        dVar13 = 0.0;
        uVar4 = 0;
        uVar3 = uVar2;
        pdVar5 = jac;
        pdVar6 = dx;
        do {
          uVar7 = 0;
          dVar10 = 0.0;
          pdVar8 = L;
          do {
            dVar10 = dVar10 + (*pdVar8 * pdVar5[uVar7]) / (pdVar6[uVar7] * pdVar6[uVar7]);
            pdVar8 = pdVar8 + uVar2;
            uVar7 = uVar7 + 1;
          } while (uVar3 != uVar7);
          dVar13 = dVar13 + dVar10 * dVar10;
          uVar4 = uVar4 + 1;
          L = L + uVar2 + 1;
          pdVar6 = pdVar6 + 1;
          pdVar5 = pdVar5 + 1;
          uVar3 = uVar3 - 1;
        } while (uVar4 != uVar2);
      }
      dVar9 = dVar9 * dVar9;
      if (0 < N) {
        uVar3 = 0;
        do {
          ssd[uVar3] = (jac[uVar3] * (-dVar9 / dVar13)) / dx[uVar3];
          uVar3 = uVar3 + 1;
        } while ((uint)N != uVar3);
      }
      if (dVar9 < 0.0) {
        dVar11 = sqrt(dVar9);
      }
      else {
        dVar11 = SQRT(dVar9);
      }
      mmult(jac,sN,C,1,N,1);
      dVar10 = (dVar9 * 0.8 * dVar9) / (ABS(*C) * dVar13) + 0.2;
      if (0 < N) {
        uVar3 = 0;
        do {
          v[uVar3] = dx[uVar3] * dVar10 * sN[uVar3] - ssd[uVar3];
          uVar3 = uVar3 + 1;
        } while ((uint)N != uVar3);
      }
      dVar13 = (dVar11 * dVar9) / dVar13;
      if (((dVar12 == -1.0) && (!NAN(dVar12))) && (dVar12 = dVar13, maxstep <= dVar13)) {
        dVar12 = maxstep;
      }
    }
    if (dVar10 * nlen <= dVar12) {
      if (0 < N) {
        uVar3 = 0;
        do {
          step[uVar3] = sN[uVar3] * (dVar12 / nlen);
          uVar3 = uVar3 + 1;
        } while ((uint)N != uVar3);
      }
    }
    else if (dVar13 < dVar12) {
      mmult(v,ssd,C_00,1,N,1);
      mmult(v,v,C_01,1,N,1);
      dVar9 = *C_00;
      dVar11 = dVar9 * dVar9 - (dVar13 * dVar13 - dVar12 * dVar12) * *C_01;
      if (dVar11 < 0.0) {
        dVar11 = sqrt(dVar11);
      }
      else {
        dVar11 = SQRT(dVar11);
      }
      if (0 < N) {
        dVar1 = *C_01;
        uVar3 = 0;
        do {
          step[uVar3] = (v[uVar3] * ((dVar11 - dVar9) / dVar1)) / dx[uVar3] + ssd[uVar3] / dx[uVar3]
          ;
          uVar3 = uVar3 + 1;
        } while ((uint)N != uVar3);
      }
    }
    else if (0 < N) {
      uVar3 = 0;
      do {
        step[uVar3] = (ssd[uVar3] * (dVar12 / dVar13)) / dx[uVar3];
        uVar3 = uVar3 + 1;
      } while ((uint)N != uVar3);
    }
  }
  *ioval = dVar12;
  ioval[1] = dVar13;
  ioval[2] = dVar10;
  free(vec);
  free(C_00);
  free(C_01);
  free(C);
  return;
}

Assistant:

void trstep_ddl(double *jac,double *sN,int N,double * dx,double maxstep,double *L,double *hess,double nlen,double *ioval,
		double *ssd,double *v,double *step) {
	int i,j;
	double tvec,temp;
	double alpha,beta;
	double delta,clen,neta,lambda;
	double *temp1,*slstep;
	double *t1,*t2;
	
	
	delta = ioval[0];clen = ioval[1]; neta = ioval[2];
	
	temp1 = (double*) malloc(sizeof(double) *N);
	slstep = (double*) malloc(sizeof(double) *1);
	t1 = (double*) malloc(sizeof(double) *1);
	t2 = (double*) malloc(sizeof(double) *1);
	
	if (nlen <= delta) {
		ioval[6] = 1.0;
		for(i=0;i <N;++i) {
			step[i] = sN[i];
		}
		delta = nlen;
		
	} else {
		ioval[6] = 0.0;
		if (ioval[7] == 1.0) {
			ioval[7] = 0.0;
			for(i=0;i < N;++i) {
				temp1[i] = jac[i] / dx[i];
			}
			
			tvec = l2norm(temp1,N);
			alpha = tvec*tvec;
			beta = 0.0; 
			
			for (i = 0; i < N;++i) {
				temp = 0.0;
				for(j = i; j < N;++j) {
					temp += L[j*N + i] * jac[j] /(dx[j] * dx[j]);
				}
				beta += temp*temp;
			}
			tvec = - alpha / beta;
			for (i = 0; i < N;++i) {
				ssd[i] = tvec * jac[i] / dx[i];
			}
			
			clen = alpha * sqrt(alpha) / beta;
			mmult(jac,sN,slstep,1,N,1);
			neta = 0.2 + ((0.8 * alpha * alpha) /(beta *fabs(slstep[0])));
			
			for (i = 0; i < N;++i) {
				v[i] = neta * dx[i] *sN[i] - ssd[i];
			}
			
			if (delta == -1.0) {
				if (clen < maxstep) {
					delta = clen;
				} else {
					delta = maxstep;
				}
			}
			
		}
		
		if (neta * nlen <= delta) {
			tvec = delta / nlen;
			for(i = 0; i < N;++i) {
				step[i] = tvec * sN[i];
			}
		} else if (clen >= delta) {
			tvec = delta /clen;
			for (i = 0; i < N;++i) {
				step[i] = tvec * ssd[i] / dx[i];
			}
		} else {
			mmult(v,ssd,t1,1,N,1);
			mmult(v,v,t2,1,N,1);
			lambda = (-t1[0] + sqrt(t1[0]*t1[0] - t2[0]*(clen*clen - delta*delta)))/t2[0];
			
			for (i = 0; i < N; ++i) {
				step[i] = (ssd[i] / dx[i]) + (lambda * v[i] / dx[i] );
			}
		}
		
			
	}
	
	ioval[0] = delta; ioval[1] = clen; ioval[2] = neta;
	
	free(temp1);
	free(t1);
	free(t2);
	free(slstep);
}